

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::processLogAndErrorCommand(CommonCore *this,ActionMessage *cmd)

{
  BrokerBase *this_00;
  action_t aVar1;
  BaseTimeCoordinator *pBVar2;
  string_view message;
  string_view message_00;
  string *psVar3;
  FedInfo **ppFVar4;
  size_type sVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  GlobalFederateId GVar9;
  FedInfo **ppFVar10;
  bool fromRemote;
  string_view name;
  string_view name_00;
  string_view estring;
  string_view message_01;
  string_view message_02;
  string_view estring_00;
  string_view message_03;
  string_view message_04;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> fed;
  size_t sVar12;
  byte *pbVar13;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> local_70;
  size_t local_58;
  byte *pbStack_50;
  size_t local_48;
  byte *pbStack_40;
  size_t local_38;
  byte *pbStack_30;
  pointer pcVar11;
  
  aVar1 = cmd->messageAction;
  if (aVar1 < cmd_error) {
    if ((aVar1 == cmd_log) || (aVar1 == cmd_remote_log)) {
      if ((cmd->dest_id).gid != (this->super_BrokerBase).global_broker_id_local.gid)
      goto LAB_002fe7e3;
      iVar6 = cmd->messageID;
      psVar3 = ActionMessage::getString_abi_cxx11_(cmd,0);
      pcVar11 = (psVar3->_M_dataplus)._M_p;
      sVar5 = psVar3->_M_string_length;
      sVar12 = (cmd->payload).bufferSize;
      pbVar13 = (cmd->payload).heap;
      fromRemote = cmd->messageAction == cmd_remote_log;
      GVar9.gid = 0;
      local_38 = sVar12;
      pbStack_30 = pbVar13;
    }
    else {
      if (aVar1 != cmd_warning) {
        return;
      }
      if ((cmd->dest_id).gid != (this->super_BrokerBase).global_broker_id_local.gid) {
LAB_002fe7e3:
        routeMessage(this,cmd);
        return;
      }
      GVar9.gid = (cmd->source_id).gid;
      psVar3 = ActionMessage::getString_abi_cxx11_(cmd,0);
      pcVar11 = (psVar3->_M_dataplus)._M_p;
      sVar5 = psVar3->_M_string_length;
      sVar12 = (cmd->payload).bufferSize;
      pbVar13 = (cmd->payload).heap;
      iVar6 = 3;
      fromRemote = false;
      local_48 = sVar12;
      pbStack_40 = pbVar13;
    }
    message._M_str = (char *)pbVar13;
    message._M_len = sVar12;
    name._M_str = pcVar11;
    name._M_len = sVar5;
    BrokerBase::sendToLogger(&this->super_BrokerBase,GVar9,iVar6,name,message,fromRemote);
    return;
  }
  if ((aVar1 != cmd_error) && (aVar1 != cmd_local_error)) {
    if (aVar1 != cmd_global_error) {
      return;
    }
    if ((this->super_BrokerBase).brokerState._M_i == CONNECTING) {
      processDisconnect(this,false);
    }
    estring._M_str = (char *)(cmd->payload).heap;
    estring._M_len = (cmd->payload).bufferSize;
    BrokerBase::setErrorState(&this->super_BrokerBase,cmd->messageID,estring);
    if (6 < (ushort)((this->super_BrokerBase).brokerState._M_i + CONNECTED_ERROR)) {
      return;
    }
    message_01._M_str = (char *)(cmd->payload).heap;
    message_01._M_len = (cmd->payload).bufferSize;
    sendErrorToFederates(this,cmd->messageID,message_01);
    iVar6 = (cmd->source_id).gid;
    if (iVar6 == 1 || iVar6 == (this->super_BrokerBase).higher_broker_id.gid) {
      return;
    }
LAB_002fe8f1:
    (*(this->super_Core)._vptr_Core[0x6c])(this,0,cmd);
    return;
  }
  this_00 = &this->super_BrokerBase;
  iVar6 = (cmd->dest_id).gid;
  if (iVar6 != (this->super_BrokerBase).global_broker_id_local.gid) {
    if (iVar6 == 0) {
      if ((this->super_BrokerBase).terminate_on_error == true) {
        if ((this->super_BrokerBase).brokerState._M_i != ERRORED) {
          message_03._M_str = (char *)(cmd->payload).heap;
          message_03._M_len = (cmd->payload).bufferSize;
          sendErrorToFederates(this,cmd->messageID,message_03);
          BrokerBase::setBrokerState(this_00,ERRORED);
        }
        ActionMessage::setAction(cmd,cmd_global_error);
        (cmd->source_id).gid = (this->super_BrokerBase).global_broker_id_local.gid;
        (cmd->dest_id).gid = 1;
        goto LAB_002fe8f1;
      }
      iVar6 = (cmd->source_id).gid;
      if ((iVar6 != -2010000000) && (iVar6 != -1700000000)) {
        gmlc::containers::
        DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
        ::find(&local_70,&this->loopFederates,&cmd->source_id);
        iVar6 = (this->loopFederates).dataStorage.bsize;
        ppFVar4 = (this->loopFederates).dataStorage.dataptr;
        lVar7 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
        if (ppFVar4 == (FedInfo **)0x0) {
          ppFVar10 = &gmlc::containers::
                      StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
                      ::emptyValue;
        }
        else {
          ppFVar10 = ppFVar4 + lVar7 + 1;
        }
        ppFVar4 = ppFVar4 + lVar7;
        if (iVar6 == 0x20) {
          ppFVar4 = ppFVar10;
          iVar6 = 0;
        }
        if (ppFVar4 == local_70.vec) {
          if (iVar6 == local_70.offset) goto LAB_002fe802;
        }
        else if ((((local_70.vec != (FedInfo **)0x0) && (ppFVar4 != (FedInfo **)0x0)) &&
                 (*local_70.vec == (FedInfo *)0x0)) &&
                (iVar6 == local_70.offset && *ppFVar4 == (FedInfo *)0x0)) goto LAB_002fe802;
        (local_70.ptr)->state = ERROR_STATE;
      }
    }
LAB_002fe802:
    routeMessage(this,cmd);
    return;
  }
  GVar9.gid = (cmd->source_id).gid;
  if ((uint)GVar9.gid < 2 || GVar9.gid == (this->super_BrokerBase).higher_broker_id.gid) {
    message_02._M_str = (char *)(cmd->payload).heap;
    message_02._M_len = (cmd->payload).bufferSize;
    sendErrorToFederates(this,cmd->messageID,message_02);
    estring_00._M_str = (char *)(cmd->payload).heap;
    estring_00._M_len = (cmd->payload).bufferSize;
    BrokerBase::setErrorState(this_00,cmd->messageID,estring_00);
    goto LAB_002fea18;
  }
  psVar3 = getFederateNameNoThrow_abi_cxx11_(this,GVar9);
  local_58 = (cmd->payload).bufferSize;
  pbStack_50 = (cmd->payload).heap;
  message_00._M_str = (char *)pbStack_50;
  message_00._M_len = local_58;
  name_00._M_str = (psVar3->_M_dataplus)._M_p;
  name_00._M_len = psVar3->_M_string_length;
  BrokerBase::sendToLogger(this_00,(GlobalFederateId)0x0,0,name_00,message_00,false);
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::find
            (&local_70,&this->loopFederates,&cmd->source_id);
  iVar6 = (this->loopFederates).dataStorage.bsize;
  ppFVar4 = (this->loopFederates).dataStorage.dataptr;
  lVar7 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
  if (ppFVar4 == (FedInfo **)0x0) {
    ppFVar10 = &gmlc::containers::
                StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
                emptyValue;
  }
  else {
    ppFVar10 = ppFVar4 + lVar7 + 1;
  }
  ppFVar4 = ppFVar4 + lVar7;
  if (iVar6 == 0x20) {
    ppFVar4 = ppFVar10;
  }
  iVar8 = 0;
  if (iVar6 != 0x20) {
    iVar8 = iVar6;
  }
  if (ppFVar4 == local_70.vec) {
    if (iVar8 == local_70.offset) goto LAB_002fe965;
LAB_002fe9e2:
    if ((cmd->flags & 0x20) == 0) {
      (local_70.ptr)->state = ERROR_STATE;
    }
    else {
      FederateState::addAction((local_70.ptr)->fed,cmd);
    }
  }
  else {
    if (((local_70.vec == (FedInfo **)0x0) || (ppFVar4 == (FedInfo **)0x0)) ||
       ((*local_70.vec != (FedInfo *)0x0 || (iVar8 != local_70.offset || *ppFVar4 != (FedInfo *)0x0)
        ))) goto LAB_002fe9e2;
LAB_002fe965:
    if ((cmd->source_id).gid == (this->filterFedID)._M_i.gid) {
      FilterFederate::handleMessage(this->filterFed,cmd);
    }
  }
  if ((this->super_BrokerBase).hasTimeDependency == true) {
    pBVar2 = (this->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
    (*pBVar2->_vptr_BaseTimeCoordinator[3])(pBVar2,cmd);
  }
LAB_002fea18:
  if ((this->super_BrokerBase).terminate_on_error == true) {
    if (((this->super_BrokerBase).brokerState._M_i != ERRORED) &&
       ((this->super_BrokerBase).brokerState._M_i != CONNECTED_ERROR)) {
      message_04._M_str = (char *)(cmd->payload).heap;
      message_04._M_len = (cmd->payload).bufferSize;
      sendErrorToFederates(this,cmd->messageID,message_04);
      BrokerBase::setBrokerState(this_00,ERRORED);
    }
    ActionMessage::setAction(cmd,cmd_global_error);
    (cmd->source_id).gid = (this->super_BrokerBase).global_broker_id_local.gid;
    (cmd->dest_id).gid = 1;
    (*(this->super_Core)._vptr_Core[0x6c])(this,0,cmd);
  }
  return;
}

Assistant:

void CommonCore::processLogAndErrorCommand(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_LOG:
        case CMD_REMOTE_LOG:
            if (cmd.dest_id == global_broker_id_local) {
                sendToLogger(parent_broker_id,
                             cmd.messageID,
                             cmd.getString(0),
                             cmd.payload.to_string(),
                             cmd.action() == CMD_REMOTE_LOG);
            } else {
                routeMessage(cmd);
            }
            break;
        case CMD_WARNING:
            if (cmd.dest_id == global_broker_id_local) {
                sendToLogger(cmd.source_id,
                             LogLevels::WARNING,
                             cmd.getString(0),
                             cmd.payload.to_string());
            } else {
                routeMessage(cmd);
            }
            break;
        case CMD_ERROR:
        case CMD_LOCAL_ERROR:
            if (cmd.dest_id == global_broker_id_local) {
                if (cmd.source_id == higher_broker_id || cmd.source_id == parent_broker_id ||
                    cmd.source_id == gRootBrokerID) {
                    sendErrorToFederates(cmd.messageID, cmd.payload.to_string());
                    setErrorState(cmd.messageID, cmd.payload.to_string());

                } else {
                    sendToLogger(parent_broker_id,
                                 LogLevels::ERROR_LEVEL,
                                 getFederateNameNoThrow(cmd.source_id),
                                 cmd.payload.to_string());
                    auto fed = loopFederates.find(cmd.source_id);
                    if (fed != loopFederates.end()) {
                        if (checkActionFlag(cmd, indicator_flag)) {
                            fed->fed->addAction(cmd);
                        } else {
                            fed->state = OperatingState::ERROR_STATE;
                        }

                    } else if (cmd.source_id == filterFedID) {
                        filterFed->handleMessage(cmd);
                        // filterFed->
                    }

                    if (hasTimeDependency) {
                        timeCoord->processTimeMessage(cmd);
                    }
                }
                if (terminate_on_error) {
                    if (getBrokerState() != BrokerState::ERRORED &&
                        getBrokerState() != BrokerState::CONNECTED_ERROR) {
                        sendErrorToFederates(cmd.messageID, cmd.payload.to_string());
                        setBrokerState(BrokerState::ERRORED);
                    }
                    cmd.setAction(CMD_GLOBAL_ERROR);
                    cmd.source_id = global_broker_id_local;
                    cmd.dest_id = gRootBrokerID;
                    transmit(parent_route_id, std::move(cmd));
                }
            } else {
                if (cmd.dest_id == parent_broker_id) {
                    if (terminate_on_error) {
                        if (getBrokerState() != BrokerState::ERRORED) {
                            sendErrorToFederates(cmd.messageID, cmd.payload.to_string());
                            setBrokerState(BrokerState::ERRORED);
                        }
                        cmd.setAction(CMD_GLOBAL_ERROR);
                        cmd.source_id = global_broker_id_local;
                        cmd.dest_id = gRootBrokerID;
                        transmit(parent_route_id, std::move(cmd));
                        break;
                    }
                    if (cmd.source_id.isValid()) {
                        auto fed = loopFederates.find(cmd.source_id);
                        if (fed != loopFederates.end()) {
                            fed->state = OperatingState::ERROR_STATE;
                        }
                    }
                }
                routeMessage(cmd);
            }
            break;
        case CMD_GLOBAL_ERROR:

            if (getBrokerState() == BrokerState::CONNECTING) {
                processDisconnect();
            }
            setErrorState(cmd.messageID, cmd.payload.to_string());
            if (isConnected()) {
                sendErrorToFederates(cmd.messageID, cmd.payload.to_string());
                if (!(cmd.source_id == higher_broker_id || cmd.source_id == gRootBrokerID)) {
                    transmit(parent_route_id, std::move(cmd));
                }
            }
            break;
        default:
            break;
    }
}